

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,Slice *item)

{
  Exception *this_00;
  ValueLength __n;
  void *__dest;
  uint8_t *__src;
  undefined8 *in_RSI;
  ValueLength in_RDI;
  ValueLength l;
  undefined8 in_stack_ffffffffffffffb8;
  ExceptionType type;
  Builder *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar1;
  Builder *in_stack_ffffffffffffffd8;
  
  type = (ExceptionType)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  checkKeyHasValidType(in_stack_ffffffffffffffd8,(uint8_t *)*in_RSI);
  uVar1 = false;
  if ((*(byte *)(*(long *)(in_RDI + 0xb0) + 0x28) & 1) != 0) {
    uVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isCustom
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       0x115731);
  }
  if ((bool)uVar1 == false) {
    __n = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     in_stack_ffffffffffffffc0);
    if (__n != 0) {
      reserve((Builder *)CONCAT17(uVar1,in_stack_ffffffffffffffd0),in_RDI);
      __dest = (void *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20));
      __src = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         0x1157b8);
      memcpy(__dest,__src,__n);
      advance(in_stack_ffffffffffffffc0,(size_t)__dest);
    }
    return (uint8_t *)((*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20)) - __n);
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,type);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t* Builder::set(Slice const& item) {
  checkKeyHasValidType(item);

  if (VELOCYPACK_UNLIKELY(options->disallowCustom && item.isCustom())) {
    // Custom values explicitly disallowed as a security precaution
    throw Exception(Exception::BuilderCustomDisallowed);
  }

  ValueLength const l = item.byteSize();
  if (l != 0) {
    reserve(l);
    VELOCYPACK_ASSERT(item.start() != nullptr);
    std::memcpy(_start + _pos, item.start(), checkOverflow(l));
    advance(l);
  }
  return _start + _pos - l;
}